

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

void __thiscall
doublechecked::Roaring64Map::flip(Roaring64Map *this,uint64_t range_start,uint64_t range_end)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  ulong local_40;
  _Alloc_node local_38;
  
  if (range_start < range_end) {
    roaring::Roaring64Map::flipClosed(&this->plain,range_start,range_end - 1);
    p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position._M_node = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < range_start]) {
      if (*(ulong *)(p_Var2 + 1) >= range_start) {
        __position._M_node = p_Var2;
      }
    }
    this_00 = &this->check;
    local_40 = range_start;
    do {
      if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
         (local_40 < *(ulong *)(__position._M_node + 1))) {
        local_38._M_t = &this_00->_M_t;
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::
        _M_insert_unique_<unsigned_long_const&,std::_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>::_Alloc_node>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)this_00,(const_iterator)__position._M_node,&local_40,&local_38);
      }
      else {
        __position = std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                         *)this_00,__position._M_node);
      }
      local_40 = local_40 + 1;
    } while (local_40 < range_end);
  }
  return;
}

Assistant:

void flip(uint64_t min, uint64_t max) {
        if (min >= max) {
            return;
        }
        flipClosed(min, max - 1);
    }